

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.hpp
# Opt level: O3

void __thiscall Callable::~Callable(Callable *this)

{
  _Manager_type p_Var1;
  
  p_Var1 = (this->one_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->one_,(_Any_data *)&this->one_,__destroy_functor);
  }
  p_Var1 = (this->zero_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)this,(_Any_data *)this,__destroy_functor);
  }
  return;
}

Assistant:

Callable(std::function<void()> f) : zero_(f) {}